

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen10CachePolicy.cpp
# Opt level: O3

GMM_STATUS __thiscall GmmLib::GmmGen10CachePolicy::InitCachePolicy(GmmGen10CachePolicy *this)

{
  anon_union_8_2_649915e9_for_GMM_CACHE_POLICY_ELEMENT_REC_1 *paVar1;
  undefined2 uVar2;
  undefined4 uVar3;
  GMM_CACHE_POLICY_ELEMENT *pGVar4;
  Context *pCVar5;
  undefined4 uVar6;
  ushort uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  GMM_CACHE_POLICY_ELEMENT CachePolicyUsage;
  GMM_CACHE_POLICY_ELEMENT *pGVar10;
  ulong uVar11;
  uint8_t uVar12;
  uint16_t uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  long lVar19;
  undefined8 in_stack_ffffffffffffffb0;
  uint64_t local_48;
  uint64_t PTEValue;
  GmmGen10CachePolicy *local_38;
  
  pGVar4 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pCachePolicy;
  if (pGVar4 == (GMM_CACHE_POLICY_ELEMENT *)0x0) {
    return GMM_ERROR;
  }
  paVar1 = &pGVar4[1].field_1;
  *(byte *)paVar1 = *(byte *)paVar1 & 0xfe;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[1].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[1].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[1].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[1].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x12].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x12].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x12].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x12].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x12].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1b].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1b].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1b].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1b].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1d].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1d].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1d].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1d].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1d].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1d].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1f].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1f].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1f].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  pGVar4 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pCachePolicy;
  pGVar4[0x20].field_1.Value =
       pGVar4[0x20].field_1.Value & 0xfffffffffffffffe |
       (ulong)(*(uint *)&(((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                           super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 0x13 & 1
              );
  pCVar5 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pGmmLibContext;
  if (((pCVar5->SkuTable).field_1.field_0x1 & 2) == 0) {
    uVar11 = 0;
  }
  else {
    uVar11 = (ulong)(~(uint)((ulong)*(undefined8 *)&(pCVar5->WaTable).field_0x4 >> 0x22) & 2);
  }
  pGVar4 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pCachePolicy;
  pGVar4[0x20].field_1.Value = pGVar4[0x20].field_1.Value & 0xfffffffffffffffd | uVar11;
  pGVar4 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pCachePolicy;
  pGVar4[0x20].field_1.Value =
       pGVar4[0x20].field_1.Value & 0xfffffffffffffffb |
       (ulong)(*(uint *)&(((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                           super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 0x11 & 4
              );
  pCVar5 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pGmmLibContext;
  if (((ulong)(pCVar5->SkuTable).field_1 & 0x80200) == 0x200) {
    uVar11 = (ulong)(~*(uint *)&(pCVar5->WaTable).field_0x8 & 8);
  }
  else {
    uVar11 = 0;
  }
  pGVar4 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pCachePolicy;
  pGVar4[0x20].field_1.Value = pGVar4[0x20].field_1.Value & 0xfffffffffffffff7 | uVar11;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x20].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x20].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x22].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x22].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x26].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x26].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x26].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x26].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x26].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x26].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x26].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x26].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x26].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x26].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x26].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x26].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x26].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x26].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x26].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x26].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x26].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x26].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x26].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x26].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x26].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x26].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x26].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x26].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2c].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2c].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2c].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2c].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2f].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2f].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2f].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x30].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x30].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value | 0x40000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x32].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x32].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x32].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x32].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x32].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x35].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x35].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x35].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x35].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x35].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x36].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x36].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x36].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x36].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x37].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x37].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x38].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x38].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x38].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x38].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x38].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x41].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x41].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x41].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x43].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x43].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x43].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x40].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x40].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x40].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x40].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x40].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x40].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x40].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x40].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x40].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x40].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x40].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x40].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x40].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x40].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x40].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x40].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x40].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x40].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x40].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x40].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x40].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x40].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x40].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x40].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x48].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x48].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x48].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4b].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4b].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4b].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x50].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x50].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x51].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x51].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x51].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x51].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x51].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x56].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x56].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x56].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x56].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x56].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x56].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x56].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x56].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x56].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x56].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x56].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x56].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x56].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x56].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x56].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x56].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x56].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x56].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x56].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x56].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x56].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x56].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x56].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x56].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x57].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x57].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x57].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x57].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x57].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x57].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x57].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x57].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x57].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x57].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x57].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x57].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x57].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x57].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x57].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x57].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x57].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x57].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x57].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x57].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x57].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x57].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x57].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x57].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x58].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x58].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x58].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x58].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x58].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x58].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x58].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x58].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x58].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x58].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x58].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x58].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x58].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x58].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x58].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x58].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x58].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x58].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x58].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x58].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x58].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x58].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x58].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x58].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x59].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x59].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x59].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x59].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x59].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x59].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x59].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x59].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x59].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x59].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x59].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x59].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x59].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x59].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x59].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x59].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x59].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x59].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x59].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x59].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x59].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x59].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x59].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x59].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5a].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5a].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5a].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5a].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5a].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5a].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5b].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5b].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5b].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5b].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5b].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5b].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5c].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5c].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5c].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5c].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5c].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x62].field_1;
  paVar1->Value = paVar1->Value | 1;
  pGVar4 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pCachePolicy;
  pGVar4[0x62].field_1.Value =
       pGVar4[0x62].field_1.Value & 0xfffffffffffffffd |
       (ulong)(*(uint *)&(((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                           super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2);
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x62].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar4 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pCachePolicy;
  pGVar4[0x62].field_1.Value = pGVar4[0x62].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x62].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x65].field_1;
  paVar1->Value = paVar1->Value | 1;
  pGVar4 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pCachePolicy;
  pGVar4[0x65].field_1.Value =
       pGVar4[0x65].field_1.Value & 0xfffffffffffffffd |
       (ulong)(*(uint *)&(((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                           super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2);
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x65].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x65].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x65].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x65].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x65].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x65].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x65].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x65].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x65].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x65].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x65].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x65].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x65].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x65].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x65].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x65].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x65].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x65].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x65].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x65].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x65].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x65].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6e].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6e].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6e].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6e].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x70].field_1;
  paVar1->Value = paVar1->Value | 1;
  pGVar4 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pCachePolicy;
  pGVar4[0x70].field_1.Value =
       pGVar4[0x70].field_1.Value & 0xfffffffffffffffd |
       (ulong)(*(uint *)&(((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                           super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2);
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x70].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x70].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar4 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pCachePolicy;
  pGVar4[0x70].field_1.Value = pGVar4[0x70].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x70].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x70].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x70].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x70].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x70].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x70].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x70].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x70].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x70].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x70].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x70].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x70].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x70].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x70].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x70].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x70].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x70].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x70].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x70].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x71].field_1;
  paVar1->Value = paVar1->Value | 1;
  pGVar4 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pCachePolicy;
  pGVar4[0x71].field_1.Value =
       pGVar4[0x71].field_1.Value & 0xfffffffffffffffd |
       (ulong)(*(uint *)&(((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                           super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2);
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x71].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x71].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar4 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pCachePolicy;
  pGVar4[0x71].field_1.Value = pGVar4[0x71].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x71].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x71].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x71].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x71].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x71].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x71].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x71].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x71].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x71].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x71].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x71].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x71].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x71].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x71].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x71].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x71].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x71].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x71].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x71].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x73].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  pGVar4 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pCachePolicy;
  pGVar4[0x73].field_1.Value =
       pGVar4[0x73].field_1.Value & 0xfffffffffffffffd |
       (ulong)(*(uint *)&(((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                           super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2);
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x73].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x73].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x73].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x73].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x73].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x73].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x73].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x73].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x73].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x73].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x73].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x73].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x73].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x73].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x73].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x73].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x73].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x73].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x73].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x73].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x73].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x73].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x75].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  pGVar4 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pCachePolicy;
  pGVar4[0x75].field_1.Value =
       pGVar4[0x75].field_1.Value & 0xfffffffffffffffd |
       (ulong)(*(uint *)&(((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                           super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2);
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x75].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x75].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x75].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x75].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x75].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x75].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x75].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x75].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x75].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x75].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x75].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x75].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x75].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x75].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x75].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x75].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x75].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x75].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x75].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x75].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x75].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x75].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x76].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  pGVar4 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pCachePolicy;
  pGVar4[0x76].field_1.Value =
       pGVar4[0x76].field_1.Value & 0xfffffffffffffffd |
       (ulong)(*(uint *)&(((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                           super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2);
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x76].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x76].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x76].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x76].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x76].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x76].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x76].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x76].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x76].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x76].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x76].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x76].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x76].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x76].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x76].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x76].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x76].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x76].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x76].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x76].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x76].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x76].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x77].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  pGVar4 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pCachePolicy;
  pGVar4[0x77].field_1.Value =
       pGVar4[0x77].field_1.Value & 0xfffffffffffffffd |
       (ulong)(*(uint *)&(((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                           super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2);
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x77].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x77].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x77].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x77].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x77].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x77].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x77].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x77].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x77].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x77].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x77].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x77].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x77].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x77].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x77].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x77].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x77].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x77].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x77].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x77].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x77].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x77].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x79].field_1;
  paVar1->Value = paVar1->Value | 1;
  pGVar4 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pCachePolicy;
  pGVar4[0x79].field_1.Value =
       pGVar4[0x79].field_1.Value & 0xfffffffffffffffd |
       (ulong)(*(uint *)&(((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                           super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2);
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x79].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x79].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x79].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x79].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x79].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x79].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x79].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x79].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x79].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x79].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x79].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x79].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x79].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x79].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x79].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x79].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x79].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x79].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x79].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x79].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x79].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x79].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7a].field_1;
  paVar1->Value = paVar1->Value | 1;
  pGVar4 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pCachePolicy;
  pGVar4[0x7a].field_1.Value =
       pGVar4[0x7a].field_1.Value & 0xfffffffffffffffd |
       (ulong)(*(uint *)&(((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                           super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2);
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7a].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7a].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7a].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7a].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7a].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7b].field_1;
  paVar1->Value = paVar1->Value | 1;
  pGVar4 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pCachePolicy;
  pGVar4[0x7b].field_1.Value =
       pGVar4[0x7b].field_1.Value & 0xfffffffffffffffd |
       (ulong)(*(uint *)&(((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                           super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2);
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7b].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7b].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7b].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7b].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7b].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  pGVar4 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pCachePolicy;
  pGVar4[0x7c].field_1.Value =
       pGVar4[0x7c].field_1.Value & 0xfffffffffffffffd |
       (ulong)(*(uint *)&(((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                           super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2);
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7c].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7c].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7c].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7c].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7c].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  pGVar4 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pCachePolicy;
  pGVar4[0x7d].field_1.Value =
       pGVar4[0x7d].field_1.Value & 0xfffffffffffffffd |
       (ulong)(*(uint *)&(((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                           super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2);
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7d].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7d].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7d].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7d].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7d].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  pGVar4 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pCachePolicy;
  pGVar4[0x7e].field_1.Value =
       pGVar4[0x7e].field_1.Value & 0xfffffffffffffffd |
       (ulong)(*(uint *)&(((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                           super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2);
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7e].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7e].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7e].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7e].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7e].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  pGVar4 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pCachePolicy;
  pGVar4[0x7f].field_1.Value =
       pGVar4[0x7f].field_1.Value & 0xfffffffffffffffd |
       (ulong)(*(uint *)&(((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                           super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2);
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7f].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7f].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7f].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7f].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7f].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x80].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  pGVar4 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pCachePolicy;
  pGVar4[0x80].field_1.Value =
       pGVar4[0x80].field_1.Value & 0xfffffffffffffffd |
       (ulong)(*(uint *)&(((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                           super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2);
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x80].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x80].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x80].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x80].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x80].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x80].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x80].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x80].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x80].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x80].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x80].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x80].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x80].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x80].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x80].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x80].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x80].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x80].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x80].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x80].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x80].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x80].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x81].field_1;
  paVar1->Value = paVar1->Value | 1;
  pGVar4 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pCachePolicy;
  pGVar4[0x81].field_1.Value =
       pGVar4[0x81].field_1.Value & 0xfffffffffffffffd |
       (ulong)(*(uint *)&(((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                           super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2);
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x81].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x81].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x81].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x81].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x81].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x81].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x81].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x81].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x81].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x81].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x81].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x81].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x81].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x81].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x81].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x81].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x81].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x81].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x81].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x81].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x81].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x81].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x82].field_1;
  paVar1->Value = paVar1->Value | 1;
  pGVar4 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pCachePolicy;
  pGVar4[0x82].field_1.Value =
       pGVar4[0x82].field_1.Value & 0xfffffffffffffffd |
       (ulong)(*(uint *)&(((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                           super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2);
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x82].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x82].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x82].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x82].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x82].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x82].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x82].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x82].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x82].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x82].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x82].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x82].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x82].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x82].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x82].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x82].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x82].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x82].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x82].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x82].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x82].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x82].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x83].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  pGVar4 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pCachePolicy;
  pGVar4[0x83].field_1.Value =
       pGVar4[0x83].field_1.Value & 0xfffffffffffffffd |
       (ulong)(*(uint *)&(((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                           super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2);
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x83].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x83].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x83].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x83].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x83].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x83].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x83].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x83].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x83].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x83].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x83].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x83].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x83].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x83].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x83].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x83].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x83].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x83].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x83].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x83].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x83].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x83].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x84].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  pGVar4 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pCachePolicy;
  pGVar4[0x84].field_1.Value =
       pGVar4[0x84].field_1.Value & 0xfffffffffffffffd |
       (ulong)(*(uint *)&(((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                           super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2);
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x84].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x84].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x84].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x84].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x84].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x84].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x84].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x84].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x84].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x84].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x84].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x84].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x84].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x84].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x84].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x84].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x84].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x84].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x84].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x84].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x84].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x84].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x85].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  pGVar4 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pCachePolicy;
  pGVar4[0x85].field_1.Value =
       pGVar4[0x85].field_1.Value & 0xfffffffffffffffd |
       (ulong)(*(uint *)&(((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                           super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2);
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x85].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x85].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x85].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x85].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x85].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x85].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x85].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x85].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x85].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x85].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x85].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x85].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x85].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x85].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x85].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x85].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x85].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x85].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x85].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x85].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x85].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x85].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x86].field_1;
  paVar1->Value = paVar1->Value | 1;
  pGVar4 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pCachePolicy;
  pGVar4[0x86].field_1.Value =
       pGVar4[0x86].field_1.Value & 0xfffffffffffffffd |
       (ulong)(*(uint *)&(((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                           super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2);
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x86].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x86].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x86].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x86].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x86].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x86].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x86].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x86].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x86].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x86].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x86].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x86].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x86].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x86].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x86].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x86].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x86].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x86].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x86].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x86].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x86].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x86].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x87].field_1;
  paVar1->Value = paVar1->Value | 1;
  pGVar4 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pCachePolicy;
  pGVar4[0x87].field_1.Value =
       pGVar4[0x87].field_1.Value & 0xfffffffffffffffd |
       (ulong)(*(uint *)&(((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                           super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2);
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x87].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x87].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x87].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x87].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x87].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x87].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x87].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x87].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x87].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x87].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x87].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x87].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x87].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x87].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x87].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x87].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x87].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x87].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x87].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x87].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x87].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x87].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x88].field_1;
  paVar1->Value = paVar1->Value | 1;
  pGVar4 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pCachePolicy;
  pGVar4[0x88].field_1.Value =
       pGVar4[0x88].field_1.Value & 0xfffffffffffffffd |
       (ulong)(*(uint *)&(((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                           super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2);
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x88].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x88].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x88].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x88].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x88].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x88].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x88].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x88].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x88].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x88].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x88].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x88].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x88].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x88].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x88].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x88].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x88].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x88].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x88].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x88].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x88].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x88].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x89].field_1;
  paVar1->Value = paVar1->Value | 1;
  pGVar4 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pCachePolicy;
  pGVar4[0x89].field_1.Value =
       pGVar4[0x89].field_1.Value & 0xfffffffffffffffd |
       (ulong)(*(uint *)&(((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                           super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2);
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x89].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x89].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x89].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x89].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x89].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x89].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x89].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x89].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x89].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x89].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x89].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x89].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x89].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x89].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x89].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x89].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x89].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x89].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x89].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x89].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x89].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x89].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8b].field_1;
  paVar1->Value = paVar1->Value | 1;
  pGVar4 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pCachePolicy;
  pGVar4[0x8b].field_1.Value =
       pGVar4[0x8b].field_1.Value & 0xfffffffffffffffd |
       (ulong)(*(uint *)&(((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                           super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2);
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8b].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8b].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8b].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8b].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8b].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8b].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8c].field_1;
  paVar1->Value = paVar1->Value | 1;
  pGVar4 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pCachePolicy;
  pGVar4[0x8c].field_1.Value =
       pGVar4[0x8c].field_1.Value & 0xfffffffffffffffd |
       (ulong)(*(uint *)&(((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                           super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2);
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8c].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8c].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8c].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8c].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8c].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8c].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8d].field_1;
  paVar1->Value = paVar1->Value | 1;
  pGVar4 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pCachePolicy;
  pGVar4[0x8d].field_1.Value =
       pGVar4[0x8d].field_1.Value & 0xfffffffffffffffd |
       (ulong)(*(uint *)&(((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                           super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2);
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8d].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8d].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8d].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8d].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8d].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8d].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8e].field_1;
  paVar1->Value = paVar1->Value | 1;
  pGVar4 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pCachePolicy;
  pGVar4[0x8e].field_1.Value =
       pGVar4[0x8e].field_1.Value & 0xfffffffffffffffd |
       (ulong)(*(uint *)&(((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                           super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2);
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8e].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8e].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8e].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8e].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8e].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8e].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8f].field_1;
  paVar1->Value = paVar1->Value | 1;
  pGVar4 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pCachePolicy;
  pGVar4[0x8f].field_1.Value =
       pGVar4[0x8f].field_1.Value & 0xfffffffffffffffd |
       (ulong)(*(uint *)&(((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                           super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2);
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8f].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8f].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8f].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8f].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8f].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8f].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x90].field_1;
  paVar1->Value = paVar1->Value | 1;
  pGVar4 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pCachePolicy;
  pGVar4[0x90].field_1.Value =
       pGVar4[0x90].field_1.Value & 0xfffffffffffffffd |
       (ulong)(*(uint *)&(((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                           super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2);
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x90].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x90].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x90].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x90].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x90].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x90].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x90].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x90].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x90].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x90].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x90].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x90].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x90].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x90].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x90].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x90].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x90].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x90].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x90].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x90].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x90].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x90].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa1].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa1].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa1].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa1].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa1].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa1].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa2].field_1;
  paVar1->Value = paVar1->Value | 1;
  pGVar4 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pCachePolicy;
  pGVar4[0xa2].field_1.Value =
       pGVar4[0xa2].field_1.Value & 0xfffffffffffffffd |
       (ulong)(*(uint *)&(((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                           super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2);
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa2].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa2].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa2].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa2].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa2].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa3].field_1;
  paVar1->Value = paVar1->Value | 1;
  pGVar4 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pCachePolicy;
  pGVar4[0xa3].field_1.Value =
       pGVar4[0xa3].field_1.Value & 0xfffffffffffffffd |
       (ulong)(*(uint *)&(((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                           super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2);
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa3].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa3].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa3].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa3].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa3].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa3].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x99].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  pGVar4 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pCachePolicy;
  pGVar4[0x99].field_1.Value =
       pGVar4[0x99].field_1.Value & 0xfffffffffffffffd |
       (ulong)(*(uint *)&(((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                           super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2);
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x99].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x99].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x99].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x99].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x99].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x99].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x99].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x99].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x99].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x99].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x99].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x99].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x99].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x99].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x99].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x99].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x99].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x99].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x99].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x99].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x99].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x99].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  pGVar4 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pCachePolicy;
  pGVar4[0x9a].field_1.Value =
       pGVar4[0x9a].field_1.Value & 0xfffffffffffffffd |
       (ulong)(*(uint *)&(((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                           super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2);
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9a].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9a].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9a].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9a].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9a].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd4].field_1;
  paVar1->Value = paVar1->Value | 1;
  pGVar4 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pCachePolicy;
  pGVar4[0xd4].field_1.Value =
       pGVar4[0xd4].field_1.Value & 0xfffffffffffffffd |
       (ulong)(*(uint *)&(((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                           super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2);
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd4].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd4].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd4].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd4].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd4].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd4].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd5].field_1;
  paVar1->Value = paVar1->Value | 1;
  pGVar4 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pCachePolicy;
  pGVar4[0xd5].field_1.Value =
       pGVar4[0xd5].field_1.Value & 0xfffffffffffffffd |
       (ulong)(*(uint *)&(((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                           super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2);
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd5].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd5].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd5].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd5].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd5].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd5].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd6].field_1;
  paVar1->Value = paVar1->Value | 1;
  pGVar4 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pCachePolicy;
  pGVar4[0xd6].field_1.Value =
       pGVar4[0xd6].field_1.Value & 0xfffffffffffffffd |
       (ulong)(*(uint *)&(((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                           super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2);
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd6].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd6].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd6].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd6].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd6].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd7].field_1;
  paVar1->Value = paVar1->Value | 1;
  pGVar4 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pCachePolicy;
  pGVar4[0xd7].field_1.Value =
       pGVar4[0xd7].field_1.Value & 0xfffffffffffffffd |
       (ulong)(*(uint *)&(((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                           super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2);
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd7].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd7].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd7].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd7].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd7].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd8].field_1;
  paVar1->Value = paVar1->Value | 1;
  pGVar4 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pCachePolicy;
  pGVar4[0xd8].field_1.Value =
       pGVar4[0xd8].field_1.Value & 0xfffffffffffffffd |
       (ulong)(*(uint *)&(((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                           super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2);
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd8].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd8].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd8].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd8].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd8].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  pGVar4 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pCachePolicy;
  pGVar4[0x9b].field_1.Value =
       pGVar4[0x9b].field_1.Value & 0xfffffffffffffffd |
       (ulong)(*(uint *)&(((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                           super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2);
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9b].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9b].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9b].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9b].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9b].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9c].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9c].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9c].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9c].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9c].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9d].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9d].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9d].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9d].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9d].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9e].field_1;
  paVar1->Value = paVar1->Value | 1;
  pGVar4 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pCachePolicy;
  pGVar4[0x9e].field_1.Value =
       pGVar4[0x9e].field_1.Value & 0xfffffffffffffffd |
       (ulong)(*(uint *)&(((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                           super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2);
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9e].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9e].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9e].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9e].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9e].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9f].field_1;
  paVar1->Value = paVar1->Value | 1;
  pGVar4 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pCachePolicy;
  pGVar4[0x9f].field_1.Value =
       pGVar4[0x9f].field_1.Value & 0xfffffffffffffffd |
       (ulong)(*(uint *)&(((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                           super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2);
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9f].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9f].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9f].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9f].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9f].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa0].field_1;
  paVar1->Value = paVar1->Value | 1;
  pGVar4 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pCachePolicy;
  pGVar4[0xa0].field_1.Value =
       pGVar4[0xa0].field_1.Value & 0xfffffffffffffffd |
       (ulong)(*(uint *)&(((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                           super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2);
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa0].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa0].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa0].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa0].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa0].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa4].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa4].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa4].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa4].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa4].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa5].field_1;
  paVar1->Value = paVar1->Value | 1;
  pGVar4 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pCachePolicy;
  pGVar4[0xa5].field_1.Value =
       pGVar4[0xa5].field_1.Value & 0xfffffffffffffffd |
       (ulong)(*(uint *)&(((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                           super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2);
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa5].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa5].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa5].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa5].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa5].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb1].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb1].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb1].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb1].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb1].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  pGVar4 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pCachePolicy;
  pGVar4[0xb2].field_1.Value =
       pGVar4[0xb2].field_1.Value & 0xfffffffffffffffd |
       (ulong)(*(uint *)&(((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                           super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2);
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb2].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb2].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb2].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb2].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb2].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb3].field_1;
  paVar1->Value = paVar1->Value | 1;
  pGVar4 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pCachePolicy;
  pGVar4[0xb3].field_1.Value =
       pGVar4[0xb3].field_1.Value & 0xfffffffffffffffd |
       (ulong)(*(uint *)&(((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                           super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2);
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb3].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb3].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb3].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb3].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb3].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb4].field_1;
  paVar1->Value = paVar1->Value | 1;
  pGVar4 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pCachePolicy;
  pGVar4[0xb4].field_1.Value =
       pGVar4[0xb4].field_1.Value & 0xfffffffffffffffd |
       (ulong)(*(uint *)&(((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                           super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2);
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb4].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb4].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb4].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb4].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb4].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb4].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdd].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdd].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdd].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdd].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdd].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdd].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdd].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xde].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xde].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xde].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xde].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xde].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xde].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xde].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xde].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xde].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xde].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xde].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xde].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xde].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xde].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xde].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xde].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xde].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xde].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xde].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xde].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xde].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xde].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xde].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xde].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe2].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe2].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe2].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe2].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe2].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe2].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe2].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xec].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xec].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xec].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xec].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xec].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xec].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xec].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xec].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xec].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xec].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xec].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xec].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xec].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xec].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xec].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xec].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xec].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xec].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xec].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xec].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xec].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xec].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xec].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xec].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xed].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xed].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xed].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xed].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xed].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xed].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xed].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xed].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xed].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xed].field_1;
  paVar1->Value = paVar1->Value | 0x30000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xed].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xed].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xed].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xed].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xed].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xed].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xed].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xed].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xed].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xed].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xed].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xed].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xed].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xed].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  pGVar4 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pCachePolicy;
  pGVar4[0xf3].field_1.Value =
       pGVar4[0xf3].field_1.Value & 0xfffffffffffffffe |
       (ulong)(*(uint *)&(((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                           super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 0x16 & 1
              );
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar4 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pCachePolicy;
  pGVar4[0xf3].field_1.Value =
       pGVar4[0xf3].field_1.Value & 0xffffffffffffffcf |
       (ulong)(*(uint *)&(((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                           super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 0x12 &
              0x10);
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf3].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf3].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf3].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf3].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x119].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x119].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x119].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x119].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x119].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x119].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x119].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x119].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x119].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x119].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x119].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x119].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x119].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x119].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x119].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x119].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x119].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x119].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x119].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x119].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x119].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x119].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x119].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x119].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  pCVar5 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pGmmLibContext;
  pCVar5->CachePolicyTbl[0].LeCC.DwordValue =
       pCVar5->CachePolicyTbl[0].LeCC.DwordValue & 0xfff87840 | 9;
  uVar2 = pCVar5->CachePolicyTbl[0].L3;
  pCVar5->CachePolicyTbl[0].L3.UshortValue = uVar2 & 0xffc0 | 0x10;
  pCVar5->CachePolicyTbl[0].HDCL1 = '\0';
  PTEValue._4_4_ = 0x2f;
  lVar19 = 0;
  uVar18 = 0;
  local_38 = this;
LAB_0013354c:
  local_48 = 0;
  uVar11 = (local_38->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pCachePolicy[lVar19].field_1.Value;
  uVar14 = (uint)uVar11;
  uVar15 = uVar14 * 2;
  uVar17 = uVar15 & 0x18000;
  if ((uVar11 & 0xc000) == 0) {
    uVar17 = 0;
  }
  uVar17 = uVar17 | (int)(uVar14 << 0xf) >> 0x1f & uVar15 & 0x60000;
  uVar15 = (uVar15 & 0x700) + 0x80 + uVar17;
  if ((uVar11 & 0x380) == 0) {
    uVar15 = uVar17;
  }
  uVar17 = 0xb;
  if ((~uVar14 & 3) != 0) {
    if ((uVar14 & 3) == 2) {
      uVar17 = ((uVar11 & 8) == 0) + 2;
    }
    else {
      uVar17 = (uint)((uVar11 & 1) == 0) * 2 + 7;
    }
  }
  uVar17 = uVar15 | uVar14 & 0x30 | uVar17;
  uVar7 = (ushort)uVar11 & 4;
  uVar13 = ((ushort)(uVar11 >> 9) & 0xe) + 0x11 + uVar7 * 8;
  if ((uVar11 & 0x1c00) == 0) {
    uVar13 = uVar7 * 8 + 0x10;
  }
  if ((uVar11 & 0x40000) == 0) {
    uVar16 = 0;
    do {
      uVar15 = (uint)uVar16;
      if (((pCVar5->CachePolicyTbl[uVar16].LeCC.DwordValue == uVar17) &&
          (pCVar5->CachePolicyTbl[uVar16].L3.UshortValue == uVar13)) &&
         (pCVar5->CachePolicyTbl[uVar16].HDCL1 == '\0')) goto LAB_00133771;
      uVar16 = (ulong)(uVar15 + 1);
    } while (uVar15 + 1 <= uVar18);
  }
  else if (0x2f < PTEValue._4_4_) {
    uVar16 = 0x30;
    do {
      uVar15 = (uint)uVar16;
      if (((pCVar5->CachePolicyTbl[uVar16].LeCC.DwordValue == uVar17) &&
          (pCVar5->CachePolicyTbl[uVar16].L3.UshortValue == uVar13)) &&
         (pCVar5->CachePolicyTbl[uVar16].HDCL1 == '\x01')) goto LAB_00133771;
      uVar16 = (ulong)(uVar15 + 1);
    } while (uVar15 + 1 <= PTEValue._4_4_);
  }
  goto LAB_0013368a;
LAB_00133771:
  if (uVar15 == 0xffffffff) {
LAB_0013368a:
    if (PTEValue._4_4_ < 0x3d && (uVar11 & 0x40000) != 0) {
      PTEValue._4_4_ = PTEValue._4_4_ + 1;
      uVar12 = '\x01';
      uVar15 = PTEValue._4_4_;
    }
    else {
      uVar15 = 0;
      if (0x2f < uVar18) goto LAB_001336e0;
      uVar12 = (uint8_t)((uVar14 & 0x40000) >> 0x12);
      uVar18 = uVar18 + 1;
      uVar15 = uVar18;
    }
    pCVar5->CachePolicyTbl[uVar15].LeCC.DwordValue = uVar17;
    pCVar5->CachePolicyTbl[uVar15].L3.UshortValue = uVar13;
    pCVar5->CachePolicyTbl[uVar15].HDCL1 = uVar12;
  }
LAB_001336e0:
  pGVar4 = (local_38->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pCachePolicy;
  uVar3 = pGVar4[lVar19].Override;
  uVar6 = pGVar4[lVar19].IsOverridenByRegkey;
  CachePolicyUsage.PTE.field_4.HighDwordValue = uVar6;
  CachePolicyUsage.PTE.field_4.DwordValue = uVar3;
  pGVar10 = pGVar4 + lVar19;
  uVar8 = pGVar10->MemoryObjectOverride;
  uVar9 = pGVar10->field_3;
  CachePolicyUsage.field_1.Value._4_4_ = uVar9;
  CachePolicyUsage.field_1.Value._0_4_ = uVar8;
  CachePolicyUsage._0_8_ = pGVar4[lVar19].field_1.Value;
  CachePolicyUsage._16_8_ = *(GMM_PTE_CACHE_CONTROL_BITS *)(&pGVar10->MemoryObjectOverride + 2);
  CachePolicyUsage.Override = (int)in_stack_ffffffffffffffb0;
  CachePolicyUsage.IsOverridenByRegkey = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  GmmGen8CachePolicy::GetUsagePTEValue
            ((GmmGen8CachePolicy *)local_38,CachePolicyUsage,(uint32_t)lVar19,&local_48);
  (local_38->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
  pCachePolicy[lVar19].PTE.field_4.DwordValue = (uint32_t)local_48;
  (local_38->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
  pCachePolicy[lVar19].PTE.field_4.HighDwordValue = 0;
  pGVar4 = (local_38->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pCachePolicy;
  pGVar4[lVar19].MemoryObjectOverride.DwordValue =
       (pGVar4[lVar19].MemoryObjectOverride.DwordValue & 0xffffff81) + (uVar15 & 0x3f) * 2;
  (local_38->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
  pCachePolicy[lVar19].Override = 0xffffffff;
  lVar19 = lVar19 + 1;
  if (lVar19 == 0x11e) {
    (local_38->super_GmmGen9CachePolicy).CurrentMaxMocsIndex = uVar18;
    (local_38->super_GmmGen9CachePolicy).CurrentMaxL1HdcMocsIndex = PTEValue._4_4_;
    return GMM_SUCCESS;
  }
  goto LAB_0013354c;
}

Assistant:

GMM_STATUS GmmLib::GmmGen10CachePolicy::InitCachePolicy()
{

    __GMM_ASSERTPTR(pCachePolicy, GMM_ERROR);

#define DEFINE_CACHE_ELEMENT(usage, llc, ellc, l3, wt, age, lecc_scc, l3_scc, sso, cos, hdcl1) DEFINE_CP_ELEMENT(usage, llc, ellc, l3, wt, age, 0, lecc_scc, l3_scc, 0, sso, cos, hdcl1, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0)
#include "GmmGen10CachePolicy.h"

#define TC_LLC (1)
#define TC_ELLC (0) //Is this supported anymore in TargetCache?
#define TC_LLC_ELLC (2)

#define LeCC_UNCACHEABLE (0x1)
#define LeCC_WT_CACHEABLE (0x2) //Only used as MemPushWRite disqualifier if set along with eLLC-only
#define LeCC_WB_CACHEABLE (0x3)

#define L3_UNCACHEABLE (0x1)
#define L3_WB_CACHEABLE (0x3)

#define DISABLE_SKIP_CACHING_CONTROL (0x0)
#define ENABLE_SKIP_CACHING_CONTROL (0x1)

#define DISABLE_SELF_SNOOP_OVERRIDE (0x0)
#define ENABLE_SELF_SNOOP_OVERRIDE (0x1)
#define ENABLE_SELF_SNOOP_ALWAYS (0x3)
#define CLASS_SERVICE_ZERO 0
    {
        // Define index of cache element
        uint32_t Usage = 0;

        uint32_t                      CurrentMaxIndex        = 0;
        uint32_t                      CurrentMaxHDCL1Index   = GMM_GEN10_HDCL1_MOCS_INDEX_START - 1; // define constant
        GMM_CACHE_POLICY_TBL_ELEMENT *pCachePolicyTlbElement = pGmmLibContext->GetCachePolicyTlbElement();

        // index 0 is uncached.
        {
            GMM_CACHE_POLICY_TBL_ELEMENT *Entry0 = &(pCachePolicyTlbElement[0]);
            Entry0->LeCC.Cacheability            = LeCC_UNCACHEABLE;
            Entry0->LeCC.TargetCache             = TC_LLC_ELLC;
            Entry0->LeCC.LRUM                    = 0;
            Entry0->LeCC.ESC                     = DISABLE_SKIP_CACHING_CONTROL;
            Entry0->LeCC.SCC                     = 0;
            Entry0->LeCC.CoS                     = CLASS_SERVICE_ZERO;
            Entry0->LeCC.SelfSnoop               = DISABLE_SELF_SNOOP_OVERRIDE;
            Entry0->L3.Cacheability              = L3_UNCACHEABLE;
            Entry0->L3.ESC                       = DISABLE_SKIP_CACHING_CONTROL;
            Entry0->L3.SCC                       = 0;
            Entry0->HDCL1                        = 0;
        }

        // Process the cache policy and fill in the look up table
        for(; Usage < GMM_RESOURCE_USAGE_MAX; Usage++)
        {
            bool                         CachePolicyError = false;
            int32_t                      CPTblIdx         = -1;
            uint32_t                     j                = 0;
            uint64_t                     PTEValue         = 0;
            GMM_CACHE_POLICY_TBL_ELEMENT UsageEle         = {0};
            UsageEle.LeCC.Reserved                        = 0; // Reserved bits zeroe'd, this is so we
                                                               // we can compare the unioned LeCC.DwordValue.
            UsageEle.LeCC.SelfSnoop = DISABLE_SELF_SNOOP_OVERRIDE;
            UsageEle.LeCC.CoS       = CLASS_SERVICE_ZERO;
            UsageEle.LeCC.SCC       = 0;
            UsageEle.LeCC.ESC       = 0;
            if(pCachePolicy[Usage].SSO & ENABLE_SELF_SNOOP_OVERRIDE)
            {
                UsageEle.LeCC.SelfSnoop = pCachePolicy[Usage].SSO & ENABLE_SELF_SNOOP_ALWAYS;
            }
            if(pCachePolicy[Usage].CoS)
            {
                UsageEle.LeCC.CoS = pCachePolicy[Usage].CoS;
            }
            if(pCachePolicy[Usage].HDCL1)
            {
                UsageEle.HDCL1 = 1;
            }
            if(pCachePolicy[Usage].LeCC_SCC)
            {
                UsageEle.LeCC.SCC = pCachePolicy[Usage].LeCC_SCC;
                UsageEle.LeCC.ESC = ENABLE_SKIP_CACHING_CONTROL;
            }
            UsageEle.LeCC.LRUM = pCachePolicy[Usage].AGE;

            // default to LLC/ELLC target cache.
            UsageEle.LeCC.TargetCache  = TC_LLC_ELLC;
            UsageEle.LeCC.Cacheability = LeCC_WB_CACHEABLE;
            if(pCachePolicy[Usage].LLC && pCachePolicy[Usage].ELLC)
            {
                UsageEle.LeCC.TargetCache = TC_LLC_ELLC;
            }
            else if(pCachePolicy[Usage].LLC)
            {
                UsageEle.LeCC.TargetCache = TC_LLC;
            }
            else if(pCachePolicy[Usage].ELLC)
            {
                UsageEle.LeCC.TargetCache = TC_ELLC;
                if(pCachePolicy[Usage].WT)
                {
                    UsageEle.LeCC.Cacheability = LeCC_WT_CACHEABLE;
                }
            }
            else
            {
                UsageEle.LeCC.Cacheability = LeCC_UNCACHEABLE;
            }
            UsageEle.L3.Reserved = 0; // Reserved bits zeroe'd, this is so we
                                      // we can compare the unioned L3.UshortValue.
            UsageEle.L3.ESC          = DISABLE_SKIP_CACHING_CONTROL;
            UsageEle.L3.SCC          = 0;
            UsageEle.L3.Cacheability = pCachePolicy[Usage].L3 ? L3_WB_CACHEABLE : L3_UNCACHEABLE;

            if(pCachePolicy[Usage].L3_SCC)
            {
                UsageEle.L3.ESC = ENABLE_SKIP_CACHING_CONTROL;
                UsageEle.L3.SCC = (uint16_t)pCachePolicy[Usage].L3_SCC;
            }
            //For HDC L1 caching, MOCS Table index 48-61 should be used
            if(UsageEle.HDCL1)
            {
                for(j = GMM_GEN10_HDCL1_MOCS_INDEX_START; j <= CurrentMaxHDCL1Index; j++)
                {
                    GMM_CACHE_POLICY_TBL_ELEMENT *TblEle = &pCachePolicyTlbElement[j];
                    if(TblEle->LeCC.DwordValue == UsageEle.LeCC.DwordValue &&
                       TblEle->L3.UshortValue == UsageEle.L3.UshortValue &&
                       TblEle->HDCL1 == UsageEle.HDCL1)
                    {
                        CPTblIdx = j;
                        break;
                    }
                }
            }
            else
            {
                for(j = 0; j <= CurrentMaxIndex; j++)
                {
                    GMM_CACHE_POLICY_TBL_ELEMENT *TblEle = &pCachePolicyTlbElement[j];
                    if(TblEle->LeCC.DwordValue == UsageEle.LeCC.DwordValue &&
                       TblEle->L3.UshortValue == UsageEle.L3.UshortValue &&
                       TblEle->HDCL1 == UsageEle.HDCL1)
                    {
                        CPTblIdx = j;
                        break;
                    }
                }
            }

            // Didn't find the caching settings in one of the already programmed lookup table entries.
            // Need to add a new lookup table entry.
            if(CPTblIdx == -1)
            {
                if(UsageEle.HDCL1 && CurrentMaxHDCL1Index < GMM_GEN9_MAX_NUMBER_MOCS_INDEXES - 1)
                {
                    GMM_CACHE_POLICY_TBL_ELEMENT *TblEle = &(pCachePolicyTlbElement[++CurrentMaxHDCL1Index]);
                    CPTblIdx                             = CurrentMaxHDCL1Index;

                    TblEle->LeCC.DwordValue = UsageEle.LeCC.DwordValue;
                    TblEle->L3.UshortValue  = UsageEle.L3.UshortValue;
                    TblEle->HDCL1           = UsageEle.HDCL1;
                }
                else if(CurrentMaxIndex < GMM_GEN10_HDCL1_MOCS_INDEX_START)
                {
                    GMM_CACHE_POLICY_TBL_ELEMENT *TblEle = &(pCachePolicyTlbElement[++CurrentMaxIndex]);
                    CPTblIdx                             = CurrentMaxIndex;

                    TblEle->LeCC.DwordValue = UsageEle.LeCC.DwordValue;
                    TblEle->L3.UshortValue  = UsageEle.L3.UshortValue;
                    TblEle->HDCL1           = UsageEle.HDCL1;
                }
                else
                {
                    // Too many unique caching combinations to program the
                    // MOCS lookup table.
                    CachePolicyError = true;
                    GMM_ASSERTDPF(
                    "Cache Policy Init Error: Invalid Cache Programming, too many unique caching combinations"
                    "(we only support GMM_GEN_MAX_NUMBER_MOCS_INDEXES = %d)",
                    GMM_GEN9_MAX_NUMBER_MOCS_INDEXES - 1);
                    // Set cache policy index to uncached.
                    CPTblIdx = 0;
                }
            }

            // PTE entries do not control caching on SKL+ (for legacy context)
            if(!GetUsagePTEValue(pCachePolicy[Usage], Usage, &PTEValue))
            {
                CachePolicyError = true;
            }

            pCachePolicy[Usage].PTE.DwordValue     = PTEValue & 0xFFFFFFFF;
            pCachePolicy[Usage].PTE.HighDwordValue = 0;

            pCachePolicy[Usage].MemoryObjectOverride.Gen10.Index = CPTblIdx;

            pCachePolicy[Usage].Override = ALWAYS_OVERRIDE;

            if(CachePolicyError)
            {
                GMM_ASSERTDPF("Cache Policy Init Error: Invalid Cache Programming - Element %d", Usage);
            }
        }
        CurrentMaxMocsIndex      = CurrentMaxIndex;
        CurrentMaxL1HdcMocsIndex = CurrentMaxHDCL1Index;
    }

    return GMM_SUCCESS;
}